

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_fp16.h
# Opt level: O0

void ncnn::cast_fp16_to_fp32_sse(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 *puVar1;
  long *in_RSI;
  long *in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [64];
  float fVar5;
  __m128 _v_fp32_2;
  __m128h _v_fp16_2;
  __m256 _v_fp32_1;
  __m128h _v_fp16_1;
  __m512 _v_fp32;
  __m256h _v_fp16;
  int i;
  float *outptr;
  unsigned_short *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  Mat *m_1;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  int local_464;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 local_450;
  undefined4 local_448;
  long local_440;
  undefined4 local_438;
  undefined4 local_434;
  undefined4 local_430;
  undefined4 local_42c;
  undefined4 local_428;
  undefined8 local_420;
  undefined1 (*local_418) [64];
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined4 local_3e8;
  long local_3e0;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined8 local_3c0;
  undefined1 (*local_3b8) [32];
  int local_3ac;
  int local_3a8;
  int local_3a4;
  int local_3a0;
  int local_39c;
  int local_398;
  int local_394;
  long *local_388;
  long *local_380;
  undefined1 local_375;
  int local_374;
  undefined8 *local_368;
  undefined8 *local_358;
  undefined8 *local_348;
  undefined1 local_335;
  int local_334;
  undefined8 *local_328;
  long local_318;
  undefined4 local_30c;
  long local_308;
  undefined1 (*local_300) [64];
  undefined4 local_2f4;
  int local_2f0;
  int local_2ec;
  undefined8 *local_2e8;
  long local_2e0;
  undefined4 local_2d4;
  long local_2d0;
  undefined1 (*local_2c8) [32];
  undefined4 local_2bc;
  int local_2b8;
  int local_2b4;
  undefined8 *local_2b0;
  undefined4 local_2a4;
  long local_2a0;
  undefined4 local_294;
  long local_290;
  undefined8 *local_260;
  undefined8 *local_240;
  undefined8 *local_1f8;
  undefined8 *local_1f0;
  undefined1 (*local_1e8) [32];
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 (*local_160) [64];
  undefined1 (*local_158) [32];
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 (*local_118) [64];
  ulong local_110;
  undefined8 uStack_108;
  undefined1 (*local_f8) [32];
  ulong local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined1 (*local_c8) [64];
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  local_394 = *(int *)((long)in_RDI + 0x2c);
  local_398 = (int)in_RDI[6];
  local_39c = *(int *)((long)in_RDI + 0x34);
  local_3a0 = (int)in_RDI[7];
  local_3a4 = (int)in_RDI[3];
  local_3a8 = local_394 * local_398 * local_39c * local_3a4;
  local_388 = in_RSI;
  local_380 = in_RDI;
  for (local_3ac = 0; local_3ac < local_3a0; local_3ac = local_3ac + 1) {
    local_368 = &local_400;
    local_2b4 = *(int *)((long)local_380 + 0x2c);
    local_2b8 = (int)local_380[6];
    local_2bc = *(undefined4 *)((long)local_380 + 0x34);
    local_2c8 = (undefined1 (*) [32])(*local_380 + local_380[8] * (long)local_3ac * local_380[2]);
    local_2d0 = local_380[2];
    local_2d4 = (undefined4)local_380[3];
    local_2e0 = local_380[4];
    local_2b0 = &local_400;
    local_2a0 = (long)local_2b4 * (long)local_2b8 * local_2d0;
    local_1f8 = &local_400;
    local_358 = &local_400;
    local_328 = &local_460;
    local_2ec = *(int *)((long)local_388 + 0x2c);
    local_2f0 = (int)local_388[6];
    local_2f4 = *(undefined4 *)((long)local_388 + 0x34);
    local_300 = (undefined1 (*) [64])(*local_388 + local_388[8] * (long)local_3ac * local_388[2]);
    local_308 = local_388[2];
    local_30c = (undefined4)local_388[3];
    local_318 = local_388[4];
    local_2e8 = &local_460;
    local_290 = (long)local_2ec * (long)local_2f0 * local_308;
    local_1f0 = &local_460;
    local_348 = &local_460;
    local_3c8 = 0;
    local_3cc = 0;
    local_3d0 = 0;
    local_3d4 = 0;
    local_3e8 = 0;
    local_3f0 = 0;
    local_3f8 = 0;
    local_400 = 0;
    local_294 = 0x10;
    local_2a4 = 0x10;
    local_334 = local_3ac;
    local_335 = 1;
    local_374 = local_3ac;
    local_375 = 1;
    local_3c0 = 0;
    local_3d8 = 0;
    local_460 = 0;
    local_450 = 0;
    local_448 = 0;
    local_438 = 0;
    local_434 = 0;
    local_430 = 0;
    local_42c = 0;
    local_428 = 0;
    local_420 = 0;
    local_458 = 0;
    local_418 = local_300;
    local_3b8 = local_2c8;
    for (local_464 = 0; local_464 + 0xf < local_3a8; local_464 = local_464 + 0x10) {
      local_1e8 = local_3b8;
      local_1e0 = *(undefined8 *)*local_3b8;
      uStack_1d8 = *(undefined8 *)(*local_3b8 + 8);
      uStack_1d0 = *(undefined8 *)(*local_3b8 + 0x10);
      uStack_1c8 = *(undefined8 *)(*local_3b8 + 0x18);
      local_c0 = 0;
      uStack_b8 = 0;
      uStack_b0 = 0;
      uStack_a8 = 0;
      uStack_a0 = 0;
      uStack_98 = 0;
      uStack_90 = 0;
      uStack_88 = 0;
      auVar4 = vcvtph2psx_avx512fp16(*local_3b8);
      local_160 = local_418;
      local_500 = auVar4._0_8_;
      local_1c0 = local_500;
      uStack_4f8 = auVar4._8_8_;
      uStack_1b8 = uStack_4f8;
      uStack_4f0 = auVar4._16_8_;
      uStack_1b0 = uStack_4f0;
      uStack_4e8 = auVar4._24_8_;
      uStack_1a8 = uStack_4e8;
      uStack_4e0 = auVar4._32_8_;
      uStack_1a0 = uStack_4e0;
      uStack_4d8 = auVar4._40_8_;
      uStack_198 = uStack_4d8;
      uStack_4d0 = auVar4._48_8_;
      uStack_190 = uStack_4d0;
      uStack_4c8 = auVar4._56_8_;
      uStack_188 = uStack_4c8;
      *local_418 = auVar4;
      local_3b8 = local_3b8 + 1;
      local_418 = local_418 + 1;
    }
    for (; local_464 + 7 < local_3a8; local_464 = local_464 + 8) {
      local_158 = local_3b8;
      local_150 = *(undefined8 *)*local_3b8;
      uStack_148 = *(undefined8 *)(*local_3b8 + 8);
      auVar3 = vcvtph2psx_avx512fp16(*(undefined1 (*) [16])*local_3b8);
      local_118 = local_418;
      local_540 = auVar3._0_8_;
      local_140 = local_540;
      uStack_538 = auVar3._8_8_;
      uStack_138 = uStack_538;
      uStack_530 = auVar3._16_8_;
      uStack_130 = uStack_530;
      uStack_528 = auVar3._24_8_;
      uStack_128 = uStack_528;
      *(undefined8 *)*local_418 = local_540;
      *(undefined8 *)(*local_418 + 8) = uStack_538;
      *(undefined8 *)(*local_418 + 0x10) = uStack_530;
      *(undefined8 *)(*local_418 + 0x18) = uStack_528;
      local_3b8 = (undefined1 (*) [32])(*local_3b8 + 0x10);
      local_418 = (undefined1 (*) [64])(*local_418 + 0x20);
    }
    for (; local_260 = local_348, local_240 = local_358, local_440 = local_318,
        local_3e0 = local_2e0, local_464 + 3 < local_3a8; local_464 = local_464 + 4) {
      local_f8 = local_3b8;
      local_110 = *(ulong *)*local_3b8;
      uStack_108 = 0;
      uStack_e8 = 0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_110;
      auVar2 = vcvtph2psx_avx512fp16(auVar2);
      local_c8 = local_418;
      local_560 = auVar2._0_8_;
      local_e0 = local_560;
      uStack_558 = auVar2._8_8_;
      uStack_d8 = uStack_558;
      *(undefined8 *)*local_418 = local_560;
      *(undefined8 *)(*local_418 + 8) = uStack_558;
      local_3b8 = (undefined1 (*) [32])(*local_3b8 + 8);
      local_418 = (undefined1 (*) [64])(*local_418 + 0x10);
      local_f0 = local_110;
    }
    for (; local_464 < local_3a8; local_464 = local_464 + 1) {
      puVar1 = *local_3b8;
      local_3b8 = (undefined1 (*) [32])(*local_3b8 + 2);
      fVar5 = float16_to_float32(*(unsigned_short *)puVar1);
      *(float *)*local_418 = fVar5;
      local_418 = (undefined1 (*) [64])(*local_418 + 4);
    }
  }
  return;
}

Assistant:

static void cast_fp16_to_fp32_sse(const Mat& bottom_blob, Mat& top_blob, const Option& opt)
{
#if NCNN_AVX512FP16 && __AVX512F__ && !__AVX512FP16__
    if (ncnn::cpu_support_x86_avx512_fp16())
    {
        cast_fp16_to_fp32_sse_avx512fp16(bottom_blob, top_blob, opt);
        return;
    }
#endif

#if NCNN_F16C && __AVX__ && !__F16C__
    if (ncnn::cpu_support_x86_f16c())
    {
        cast_fp16_to_fp32_sse_f16c(bottom_blob, top_blob, opt);
        return;
    }
#endif

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int d = bottom_blob.d;
    const int channels = bottom_blob.c;
    const int elempack = bottom_blob.elempack;

    const int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const unsigned short* ptr = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);

        int i = 0;
#if __AVX512FP16__
        for (; i + 15 < size; i += 16)
        {
            __m256h _v_fp16 = (__m256h)_mm256_loadu_si256((const __m256i*)ptr);
            __m512 _v_fp32 = _mm512_cvtxph_ps(_v_fp16);
            _mm512_storeu_ps(outptr, _v_fp32);

            ptr += 16;
            outptr += 16;
        }
        for (; i + 7 < size; i += 8)
        {
            __m128h _v_fp16 = (__m128h)_mm_loadu_si128((const __m128i*)ptr);
            __m256 _v_fp32 = _mm256_cvtxph_ps(_v_fp16);
            _mm256_storeu_ps(outptr, _v_fp32);

            ptr += 8;
            outptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128h _v_fp16 = (__m128h)_mm_loadl_epi64((const __m128i*)ptr);
            __m128 _v_fp32 = _mm_cvtxph_ps(_v_fp16);
            _mm_storeu_ps(outptr, _v_fp32);

            ptr += 4;
            outptr += 4;
        }
#elif __F16C__
        for (; i + 7 < size; i += 8)
        {
            __m128i _v_fp16 = _mm_loadu_si128((const __m128i*)ptr);
            __m256 _v_fp32 = _mm256_cvtph_ps(_v_fp16);
            _mm256_storeu_ps(outptr, _v_fp32);

            ptr += 8;
            outptr += 8;
        }
        for (; i + 3 < size; i += 4)
        {
            __m128i _v_fp16 = _mm_loadl_epi64((const __m128i*)ptr);
            __m128 _v_fp32 = _mm_cvtph_ps(_v_fp16);
            _mm_storeu_ps(outptr, _v_fp32);

            ptr += 4;
            outptr += 4;
        }
#endif
        for (; i < size; i++)
        {
            *outptr++ = float16_to_float32(*ptr++);
        }
    }
}